

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O1

void __thiscall
spvtools::opt::InvocationInterlockPlacementPass::addInstructionAtBlockBoundary
          (InvocationInterlockPlacementPass *this,BasicBlock *block,Op opcode,bool at_end)

{
  Op OVar1;
  Instruction *pIVar2;
  Instruction *pIVar3;
  Instruction *this_00;
  Instruction **ppIVar4;
  undefined7 in_register_00000009;
  long lVar5;
  
  OVar1 = ((block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_)->opcode_;
  if ((int)CONCAT71(in_register_00000009,at_end) == 0) {
    if (OVar1 == OpPhi) {
      __assert_fail("block->begin()->opcode() != spv::Op::OpPhi && \"addInstructionAtBlockBoundary expects to be called with at_end == \" \"false only if there is a single predecessor to block\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp"
                    ,0x5a,
                    "void spvtools::opt::InvocationInterlockPlacementPass::addInstructionAtBlockBoundary(BasicBlock *, spv::Op, bool)"
                   );
    }
    this_00 = (Instruction *)operator_new(0x70);
    Instruction::Instruction(this_00,(this->super_Pass).context_,opcode);
    if ((this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == true) {
      __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                    ,0xae,
                    "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
                   );
    }
    pIVar2 = (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    if ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ ==
        (Instruction *)0x0) {
      __assert_fail("pos->IsInAList() && \"Pos should already be in a list.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                    ,0xaf,
                    "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
                   );
    }
    pIVar3 = (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    if (pIVar3 != (Instruction *)0x0) {
      (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
      (((this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_)->
      super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar3;
      (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = (Instruction *)0x0
      ;
      (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (Instruction *)0x0;
    }
    (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar2;
    ppIVar4 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
    (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
         (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
    (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = this_00;
    lVar5 = 8;
  }
  else {
    if (OVar1 == OpPhi) {
      __assert_fail("block->begin()->opcode() != spv::Op::OpPhi && \"addInstructionAtBlockBoundary expects to be called with at_end == \" \"true only if there is a single successor to block\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp"
                    ,0x53,
                    "void spvtools::opt::InvocationInterlockPlacementPass::addInstructionAtBlockBoundary(BasicBlock *, spv::Op, bool)"
                   );
    }
    this_00 = (Instruction *)operator_new(0x70);
    Instruction::Instruction(this_00,(this->super_Pass).context_,opcode);
    pIVar2 = (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    if ((pIVar2 == (Instruction *)0x0) ||
       ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
      __assert_fail("!insts_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                    ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
    }
    if ((this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == true) {
      __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                    ,0xba,
                    "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertAfter(NodeType *) [NodeType = spvtools::opt::Instruction]"
                   );
    }
    pIVar2 = (((block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
               super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_)->
             super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
    if ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ ==
        (Instruction *)0x0) {
      __assert_fail("pos->IsInAList() && \"Pos should already be in a list.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                    ,0xbb,
                    "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertAfter(NodeType *) [NodeType = spvtools::opt::Instruction]"
                   );
    }
    if (this_00 == pIVar2) {
      __assert_fail("this != pos && \"Can\'t insert a node after itself.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/ilist_node.h"
                    ,0xbc,
                    "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertAfter(NodeType *) [NodeType = spvtools::opt::Instruction]"
                   );
    }
    ppIVar4 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    pIVar3 = (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    if (pIVar3 != (Instruction *)0x0) {
      (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
      (((this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_)->
      super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = pIVar3;
      *ppIVar4 = (Instruction *)0x0;
      (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ =
           (Instruction *)0x0;
    }
    (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = pIVar2;
    (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ =
         (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    (pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ = this_00;
    lVar5 = 0x10;
  }
  *(Instruction **)
   ((long)&((*ppIVar4)->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase
   + lVar5) = this_00;
  return;
}

Assistant:

void InvocationInterlockPlacementPass::addInstructionAtBlockBoundary(
    BasicBlock* block, spv::Op opcode, bool at_end) {
  if (at_end) {
    assert(block->begin()->opcode() != spv::Op::OpPhi &&
           "addInstructionAtBlockBoundary expects to be called with at_end == "
           "true only if there is a single successor to block");
    // Insert a begin instruction at the end of the block.
    Instruction* begin_inst = new Instruction(context(), opcode);
    begin_inst->InsertAfter(&*--block->tail());
  } else {
    assert(block->begin()->opcode() != spv::Op::OpPhi &&
           "addInstructionAtBlockBoundary expects to be called with at_end == "
           "false only if there is a single predecessor to block");
    // Insert an end instruction at the beginning of the block.
    Instruction* end_inst = new Instruction(context(), opcode);
    end_inst->InsertBefore(&*block->begin());
  }
}